

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,PatternCaseStatement *stmt)

{
  Statement *this_00;
  int iVar1;
  int iVar2;
  ItemGroup *item;
  pointer pIVar3;
  long lVar4;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  ast::Expression::visit<TestAnalysis&>(stmt->expr,(TestAnalysis *)this);
  iVar2 = this->state;
  pIVar3 = (stmt->items)._M_ptr;
  iVar1 = 0;
  for (lVar4 = (stmt->items)._M_extent._M_extent_value * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
    this->isStateSplit = false;
    this->state = iVar2;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    ast::Pattern::visit<TestAnalysis>((pIVar3->pattern).ptr,(TestAnalysis *)this);
    if (pIVar3->filter != (Expression *)0x0) {
      visitCondition((ConstantValue *)&local_58,this,pIVar3->filter);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      this->isStateSplit = false;
      this->state = this->stateWhenTrue;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
    }
    ast::Statement::visit<TestAnalysis&>((pIVar3->stmt).ptr,(TestAnalysis *)this);
    iVar1 = iVar1 + this->state;
    pIVar3 = pIVar3 + 1;
  }
  this_00 = stmt->defaultCase;
  if (this_00 != (Statement *)0x0) {
    this->isStateSplit = false;
    this->state = iVar2;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    ast::Statement::visit<TestAnalysis&>(this_00,(TestAnalysis *)this);
    iVar2 = this->state;
  }
  this->isStateSplit = false;
  this->state = iVar2 + iVar1;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  return;
}

Assistant:

void visitStmt(const PatternCaseStatement& stmt) {
        // TODO: match handling for regular CaseStatements
        visit(stmt.expr);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            setState((DERIVED).copyState(initialState));

            visit(*item.pattern);

            if (item.filter) {
                visitCondition(*item.filter);
                setState(std::move(stateWhenTrue));
            }

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        if (stmt.defaultCase) {
            setState((DERIVED).copyState(initialState));
            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else {
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }